

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

ParseResult * __thiscall cxxopts::OptionParser::parse(OptionParser *this,int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  Value *pVVar7;
  OptionParser *pOVar8;
  element_type *this_00;
  size_t sVar9;
  long in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  ParseResult *in_RDI;
  mapped_type *store;
  Value *value_1;
  shared_ptr<cxxopts::OptionDetails> *detail;
  value_type *opt_1;
  const_iterator __end1;
  const_iterator __begin1;
  OptionMap *__range1;
  shared_ptr<cxxopts::OptionDetails> opt;
  const_iterator iter_1;
  string *name_1;
  string arg_value;
  shared_ptr<cxxopts::OptionDetails> value;
  const_iterator iter;
  string name;
  size_t i;
  string *s;
  ArguDesc argu_desc;
  bool matched;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unmatched;
  const_iterator next_positional;
  bool consume_remaining;
  int current;
  ParseResult *parsed;
  value_type *in_stack_fffffffffffffc88;
  ArguDesc *in_stack_fffffffffffffc90;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *sequential;
  undefined6 in_stack_fffffffffffffca0;
  byte in_stack_fffffffffffffca6;
  char in_stack_fffffffffffffca7;
  NameHashMap *in_stack_fffffffffffffca8;
  ParseResult *in_stack_fffffffffffffcb0;
  mapped_type *in_stack_fffffffffffffcc0;
  shared_ptr<cxxopts::OptionDetails> *in_stack_fffffffffffffcc8;
  OptionParser *in_stack_fffffffffffffcd0;
  string *in_stack_fffffffffffffcd8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  OptionParser *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffd40;
  byte in_stack_fffffffffffffd47;
  string *in_stack_fffffffffffffd58;
  shared_ptr<cxxopts::OptionDetails> *in_stack_fffffffffffffd60;
  ParseResult *argv_00;
  OptionParser *in_stack_fffffffffffffd80;
  undefined1 local_261 [33];
  OptionParser *local_240;
  OptionValue *local_238;
  string *local_230;
  shared_ptr<cxxopts::OptionDetails> *local_228;
  reference local_220;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_218;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_210 [4];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_1f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_1e8;
  undefined1 *local_1e0;
  string local_1d8 [32];
  string local_1b8 [48];
  int local_188;
  allocator<char> local_181;
  string local_180 [32];
  string local_160 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_140;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_true>
  local_138;
  allocator<char> local_129;
  string local_128 [32];
  long local_108;
  undefined1 *local_100;
  allocator<char> local_f1;
  string local_f0 [39];
  undefined1 local_c9 [49];
  undefined1 local_98 [32];
  byte local_78;
  byte local_77;
  byte local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  byte local_25;
  int local_24;
  long local_20;
  int local_14;
  
  local_24 = 1;
  local_25 = 0;
  argv_00 = in_RDI;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffc88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x13ce1a);
  while (local_24 != local_14) {
    iVar3 = strcmp(*(char **)(local_20 + (long)local_24 * 8),"--");
    if (iVar3 == 0) {
      local_25 = 1;
      local_24 = local_24 + 1;
      break;
    }
    local_49 = 0;
    values::parser_tool::ParseArgument((char *)in_RDI,(bool *)in_stack_fffffffffffffd60);
    if ((local_49 & 1) == 0) {
      if (((**(char **)(local_20 + (long)local_24 * 8) == '-') &&
          (*(char *)(*(long *)(local_20 + (long)local_24 * 8) + 1) != '\0')) &&
         ((*(byte *)(in_RSI + 5) & 1) == 0)) {
        in_stack_fffffffffffffd58 = *(string **)(local_20 + (long)local_24 * 8);
        in_stack_fffffffffffffd60 = (shared_ptr<cxxopts::OptionDetails> *)local_c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                   (allocator<char> *)in_stack_fffffffffffffcc0);
        throw_or_mimic<cxxopts::option_syntax_exception>
                  ((string *)
                   CONCAT17(in_stack_fffffffffffffca7,
                            CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)));
        std::__cxx11::string::~string((string *)(local_c9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_c9);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                 (allocator<char> *)in_stack_fffffffffffffcc0);
      in_stack_fffffffffffffd47 =
           consume_positional((OptionParser *)
                              CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                              (string *)in_stack_fffffffffffffce0._M_cur,
                              (PositionalListIterator *)in_stack_fffffffffffffcd8);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      if ((in_stack_fffffffffffffd47 & 1) == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffca7,
                               CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
                   (char **)in_stack_fffffffffffffc98);
      }
LAB_0013d832:
      local_188 = 0;
    }
    else {
      if ((local_78 & 1) != 0) {
        local_100 = local_98;
        for (local_108 = 0; lVar6 = local_108, lVar5 = std::__cxx11::string::size(), lVar6 != lVar5;
            local_108 = local_108 + 1) {
          std::__cxx11::string::operator[]((ulong)local_100);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcb0,(size_type)in_stack_fffffffffffffca8,
                     in_stack_fffffffffffffca7,(allocator<char> *)in_stack_fffffffffffffc98);
          std::allocator<char>::~allocator(&local_129);
          local_138._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                       *)in_stack_fffffffffffffc88,(key_type *)0x13d1e9);
          local_140._M_cur =
               (__node_type *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
               ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                      *)in_stack_fffffffffffffc88);
          bVar1 = std::__detail::operator==(&local_138,&local_140);
          if (bVar1) {
            if ((*(byte *)(in_RSI + 5) & 1) == 0) {
              throw_or_mimic<cxxopts::option_not_exists_exception>
                        ((string *)
                         CONCAT17(in_stack_fffffffffffffca7,
                                  CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)));
              goto LAB_0013d3b7;
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                       (allocator<char> *)in_stack_fffffffffffffcc0);
            std::__cxx11::string::operator[]((ulong)local_100);
            std::operator+(in_stack_fffffffffffffc98,
                           (char)((ulong)in_stack_fffffffffffffc90 >> 0x38));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
            std::__cxx11::string::~string(local_160);
            std::__cxx11::string::~string(local_180);
            std::allocator<char>::~allocator(&local_181);
            local_188 = 6;
          }
          else {
LAB_0013d3b7:
            std::__detail::
            _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
            ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                          *)0x13d3c4);
            std::shared_ptr<cxxopts::OptionDetails>::shared_ptr
                      ((shared_ptr<cxxopts::OptionDetails> *)in_stack_fffffffffffffc90,
                       (shared_ptr<cxxopts::OptionDetails> *)in_stack_fffffffffffffc88);
            lVar6 = local_108 + 1;
            lVar5 = std::__cxx11::string::size();
            if (lVar6 == lVar5) {
              checked_parse_arg(in_stack_fffffffffffffd80,(int)((ulong)in_RSI >> 0x20),
                                (char **)argv_00,(int *)in_RDI,in_stack_fffffffffffffd60,
                                in_stack_fffffffffffffd58);
LAB_0013d604:
              local_188 = 0;
            }
            else {
              std::
              __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x13d46a);
              pVVar7 = OptionDetails::value((OptionDetails *)0x13d472);
              uVar4 = (*pVVar7->_vptr_Value[7])();
              if ((uVar4 & 1) != 0) {
                std::
                __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x13d4ad);
                pVVar7 = OptionDetails::value((OptionDetails *)0x13d4b5);
                (*pVVar7->_vptr_Value[9])(local_1b8);
                parse_option(in_stack_fffffffffffffcf0,
                             (shared_ptr<cxxopts::OptionDetails> *)
                             CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                             (string *)in_stack_fffffffffffffce0._M_cur,in_stack_fffffffffffffcd8);
                std::__cxx11::string::~string(local_1b8);
                goto LAB_0013d604;
              }
              in_stack_fffffffffffffcf0 = (OptionParser *)(local_108 + 1);
              pOVar8 = (OptionParser *)std::__cxx11::string::size();
              if (pOVar8 <= in_stack_fffffffffffffcf0) {
                throw_or_mimic<cxxopts::option_requires_argument_exception>
                          ((string *)
                           CONCAT17(in_stack_fffffffffffffca7,
                                    CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)));
                goto LAB_0013d604;
              }
              std::__cxx11::string::substr((ulong)local_1d8,(ulong)local_100);
              parse_option(in_stack_fffffffffffffcf0,
                           (shared_ptr<cxxopts::OptionDetails> *)
                           CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                           (string *)in_stack_fffffffffffffce0._M_cur,in_stack_fffffffffffffcd8);
              local_188 = 4;
              std::__cxx11::string::~string(local_1d8);
            }
            std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr
                      ((shared_ptr<cxxopts::OptionDetails> *)0x13d61c);
          }
          std::__cxx11::string::~string(local_128);
          in_stack_fffffffffffffcec = local_188;
          if ((local_188 != 0) && (local_188 == 4)) break;
        }
        goto LAB_0013d832;
      }
      lVar6 = std::__cxx11::string::length();
      if (lVar6 == 0) goto LAB_0013d832;
      local_1e0 = local_98;
      in_stack_fffffffffffffce0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                   *)in_stack_fffffffffffffc88,(key_type *)0x13d6c5);
      local_1e8._M_cur = in_stack_fffffffffffffce0._M_cur;
      local_1f0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                  *)in_stack_fffffffffffffc88);
      bVar1 = std::__detail::operator==(&local_1e8,&local_1f0);
      if (!bVar1) {
LAB_0013d76f:
        std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
        ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                      *)0x13d77c);
        std::shared_ptr<cxxopts::OptionDetails>::shared_ptr
                  ((shared_ptr<cxxopts::OptionDetails> *)in_stack_fffffffffffffc90,
                   (shared_ptr<cxxopts::OptionDetails> *)in_stack_fffffffffffffc88);
        if ((local_77 & 1) == 0) {
          checked_parse_arg(in_stack_fffffffffffffd80,(int)((ulong)in_RSI >> 0x20),(char **)argv_00,
                            (int *)in_RDI,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        }
        else {
          parse_option(in_stack_fffffffffffffcf0,
                       (shared_ptr<cxxopts::OptionDetails> *)
                       CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                       (string *)in_stack_fffffffffffffce0._M_cur,in_stack_fffffffffffffcd8);
        }
        std::shared_ptr<cxxopts::OptionDetails>::~shared_ptr
                  ((shared_ptr<cxxopts::OptionDetails> *)0x13d82e);
        goto LAB_0013d832;
      }
      if ((*(byte *)(in_RSI + 5) & 1) == 0) {
        throw_or_mimic<cxxopts::option_not_exists_exception>
                  ((string *)
                   CONCAT17(in_stack_fffffffffffffca7,
                            CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)));
        goto LAB_0013d76f;
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffca7,
                             CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
                 (char **)in_stack_fffffffffffffc98);
      local_188 = 2;
    }
    local_24 = local_24 + 1;
    values::parser_tool::ArguDesc::~ArguDesc(in_stack_fffffffffffffc90);
  }
  local_210[1]._M_cur = (__node_type *)*in_RSI;
  local_210[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
       ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
                *)in_stack_fffffffffffffc88);
  local_218._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>_>_>
              *)in_stack_fffffffffffffc88);
  while (bVar1 = std::__detail::operator!=(local_210,&local_218), bVar1) {
    local_220 = std::__detail::
                _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                             *)0x13d8ec);
    local_228 = &local_220->second;
    std::__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x13d915);
    in_stack_fffffffffffffcd8 = (string *)OptionDetails::value((OptionDetails *)0x13d91d);
    in_stack_fffffffffffffcc8 = (shared_ptr<cxxopts::OptionDetails> *)(in_RSI + 6);
    local_230 = in_stack_fffffffffffffcd8;
    this_00 = std::
              __shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x13d94f);
    in_stack_fffffffffffffcd0 = (OptionParser *)OptionDetails::hash(this_00);
    local_240 = in_stack_fffffffffffffcd0;
    in_stack_fffffffffffffcc0 =
         std::
         unordered_map<unsigned_long,_cxxopts::OptionValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>_>
         ::operator[]((unordered_map<unsigned_long,_cxxopts::OptionValue,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>_>
                       *)in_stack_fffffffffffffc90,(key_type *)in_stack_fffffffffffffc88);
    local_238 = in_stack_fffffffffffffcc0;
    bVar2 = (**(code **)(*(long *)local_230 + 0x28))();
    if ((bVar2 & 1) == 0) {
      parse_no_value(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    }
    else {
      sVar9 = OptionValue::count(local_238);
      if ((sVar9 == 0) && (bVar1 = OptionValue::has_default(local_238), !bVar1)) {
        parse_default(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      }
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cxxopts::OptionDetails>_>,_false,_true>
                  *)in_stack_fffffffffffffc90);
  }
  if ((local_25 & 1) != 0) {
    for (; local_24 < local_14; local_24 = local_24 + 1) {
      in_stack_fffffffffffffca8 = *(NameHashMap **)(local_20 + (long)local_24 * 8);
      in_stack_fffffffffffffcb0 = (ParseResult *)local_261;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8,
                 (allocator<char> *)in_stack_fffffffffffffcc0);
      in_stack_fffffffffffffca7 =
           consume_positional((OptionParser *)
                              CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                              (string *)in_stack_fffffffffffffce0._M_cur,
                              (PositionalListIterator *)in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffca6 = in_stack_fffffffffffffca7 ^ 0xff;
      std::__cxx11::string::~string((string *)(local_261 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_261);
      if ((in_stack_fffffffffffffca6 & 1) != 0) break;
    }
    for (; local_24 != local_14; local_24 = local_24 + 1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffca7,
                             CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),
                 (char **)in_stack_fffffffffffffc98);
    }
  }
  finalise_aliases((OptionParser *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  this_01 = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)(in_RSI + 6);
  sequential = (vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)
               &stack0xfffffffffffffd80;
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::vector
            (this_01,(vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)(in_RSI + 0xd)
            );
  ParseResult::ParseResult
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             (ParsedHashMap *)
             CONCAT17(in_stack_fffffffffffffca7,
                      CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)),sequential,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector
            ((vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *)
             CONCAT17(in_stack_fffffffffffffca7,
                      CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)));
  local_188 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffca7,
                        CONCAT16(in_stack_fffffffffffffca6,in_stack_fffffffffffffca0)));
  return argv_00;
}

Assistant:

inline ParseResult
OptionParser::parse(int argc, const char* const* argv)
{
  int current = 1;
  bool consume_remaining = false;
  auto next_positional = m_positional.begin();

  std::vector<std::string> unmatched;

  while (current != argc)
  {
    if (strcmp(argv[current], "--") == 0)
    {
      consume_remaining = true;
      ++current;
      break;
    }
    bool matched = false;
    values::parser_tool::ArguDesc argu_desc =
        values::parser_tool::ParseArgument(argv[current], matched);

    if (!matched)
    {
      //not a flag

      // but if it starts with a `-`, then it's an error
      if (argv[current][0] == '-' && argv[current][1] != '\0') {
        if (!m_allow_unrecognised) {
          throw_or_mimic<option_syntax_exception>(argv[current]);
        }
      }

      //if true is returned here then it was consumed, otherwise it is
      //ignored
      if (consume_positional(argv[current], next_positional))
      {
      }
      else
      {
        unmatched.emplace_back(argv[current]);
      }
      //if we return from here then it was parsed successfully, so continue
    }
    else
    {
      //short or long option?
      if (argu_desc.grouping)
      {
        const std::string& s = argu_desc.arg_name;

        for (std::size_t i = 0; i != s.size(); ++i)
        {
          std::string name(1, s[i]);
          auto iter = m_options.find(name);

          if (iter == m_options.end())
          {
            if (m_allow_unrecognised)
            {
              unmatched.push_back(std::string("-") + s[i]);
              continue;
            }
            //error
            throw_or_mimic<option_not_exists_exception>(name);
          }

          auto value = iter->second;

          if (i + 1 == s.size())
          {
            //it must be the last argument
            checked_parse_arg(argc, argv, current, value, name);
          }
          else if (value->value().has_implicit())
          {
            parse_option(value, name, value->value().get_implicit_value());
          }
          else if (i + 1 < s.size())
          {
            std::string arg_value = s.substr(i + 1);
            parse_option(value, name, arg_value);
            break;
          }
          else
          {
            //error
            throw_or_mimic<option_requires_argument_exception>(name);
          }
        }
      }
      else if (argu_desc.arg_name.length() != 0)
      {
        const std::string& name = argu_desc.arg_name;

        auto iter = m_options.find(name);

        if (iter == m_options.end())
        {
          if (m_allow_unrecognised)
          {
            // keep unrecognised options in argument list, skip to next argument
            unmatched.emplace_back(argv[current]);
            ++current;
            continue;
          }
          //error
          throw_or_mimic<option_not_exists_exception>(name);
        }

        auto opt = iter->second;

        //equals provided for long option?
        if (argu_desc.set_value)
        {
          //parse the option given

          parse_option(opt, name, argu_desc.value);
        }
        else
        {
          //parse the next argument
          checked_parse_arg(argc, argv, current, opt, name);
        }
      }

    }

    ++current;
  }

  for (auto& opt : m_options)
  {
    auto& detail = opt.second;
    const auto& value = detail->value();

    auto& store = m_parsed[detail->hash()];

    if (value.has_default()) {
      if (!store.count() && !store.has_default()) {
        parse_default(detail);
      }
    }
    else {
      parse_no_value(detail);
    }
  }

  if (consume_remaining)
  {
    while (current < argc)
    {
      if (!consume_positional(argv[current], next_positional)) {
        break;
      }
      ++current;
    }

    //adjust argv for any that couldn't be swallowed
    while (current != argc) {
      unmatched.emplace_back(argv[current]);
      ++current;
    }
  }

  finalise_aliases();

  ParseResult parsed(std::move(m_keys), std::move(m_parsed), std::move(m_sequential), std::move(unmatched));
  return parsed;
}